

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void duckdb::MapFunctionEmptyInput(Vector *result,idx_t row_count)

{
  list_entry_t *count;
  Vector *in_RSI;
  VectorType in_stack_0000000f;
  list_entry_t *result_data;
  Vector *in_stack_ffffffffffffffd8;
  Vector *in_stack_ffffffffffffffe0;
  
  Vector::SetVectorType((Vector *)result_data,in_stack_0000000f);
  ListVector::SetListSize(in_stack_ffffffffffffffe0,(idx_t)in_stack_ffffffffffffffd8);
  count = ListVector::GetData(in_stack_ffffffffffffffd8);
  memset(&stack0xffffffffffffffd8,0,0x10);
  count->offset = (uint64_t)in_stack_ffffffffffffffd8;
  count->length = (uint64_t)in_stack_ffffffffffffffe0;
  Vector::Verify(in_RSI,(idx_t)count);
  return;
}

Assistant:

static void MapFunctionEmptyInput(Vector &result, const idx_t row_count) {
	// If no chunk is set in ExpressionExecutor::ExecuteExpression (args.data.empty(), e.g., in SELECT MAP()),
	// then we always pass a row_count of 1.
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	ListVector::SetListSize(result, 0);

	auto result_data = ListVector::GetData(result);
	result_data[0] = list_entry_t();
	result.Verify(row_count);
}